

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

void __thiscall bdNode::addPeer(bdNode *this,bdId *id,uint32_t peerflags)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined1 local_e8 [8];
  bdPeer peer;
  list<sockaddr_in,_std::allocator<sockaddr_in>_> filteredIPs_1;
  sockaddr_in knownAddr;
  bdFriendEntry entry;
  undefined1 local_38 [8];
  list<sockaddr_in,_std::allocator<sockaddr_in>_> filteredIPs;
  uint32_t peerflags_local;
  bdId *id_local;
  bdNode *this_local;
  
  filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node._M_size.
  _4_4_ = peerflags;
  iVar2 = bdFilter::checkPeer(&this->mFilterPeers,id,peerflags);
  if (iVar2 == 0) {
    bdFriendEntry::bdFriendEntry((bdFriendEntry *)knownAddr.sin_zero);
    bVar1 = bdFriendList::findPeerEntry
                      (&this->mFriendList,&id->id,(bdFriendEntry *)knownAddr.sin_zero);
    if (bVar1) {
      uVar3 = bdFriendEntry::getPeerFlags((bdFriendEntry *)knownAddr.sin_zero);
      filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node.
      _M_size._4_4_ =
           uVar3 | filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
                   _M_node._M_size._4_4_;
      bVar1 = bdFriendEntry::addrKnown
                        ((bdFriendEntry *)knownAddr.sin_zero,
                         (sockaddr_in *)
                         &filteredIPs_1.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>.
                          _M_impl._M_node._M_size);
      if ((bVar1) &&
         (filteredIPs_1.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node.
          _M_size._4_4_ != (id->addr).sin_addr.s_addr)) {
        std::operator<<((ostream *)&std::cerr,"bdNode::addPeer(");
        (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,id);
        poVar4 = std::operator<<((ostream *)&std::cerr,", ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
        pvVar5 = (void *)std::ostream::operator<<
                                   (pvVar5,filteredIPs.
                                           super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>
                                           ._M_impl._M_node._M_size._4_4_);
        std::ostream::operator<<(pvVar5,std::dec);
        std::operator<<((ostream *)&std::cerr,") MASQUERADING AS KNOWN PEER - FLAGGING AS BAD");
        std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        bdPeerQueue::queuePeer
                  (&this->mBadPeerQueue,id,
                   filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
                   _M_node._M_size._4_4_);
        bdFilter::addPeerToFilter
                  (&this->mFilterPeers,&id->addr,
                   filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
                   _M_node._M_size._4_4_);
        std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::list
                  ((list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer.mExtraFlags);
        bdFilter::filteredIPs
                  (&this->mFilterPeers,
                   (list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer.mExtraFlags);
        bdStore::filterIpList
                  (&this->mStore,
                   (list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer.mExtraFlags);
        bdSpace::flagpeer(&this->mNodeSpace,id,0,4);
        std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::~list
                  ((list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer.mExtraFlags);
        return;
      }
    }
    bdQueryManager::addPeer
              (this->mQueryMgr,id,
               filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
               _M_node._M_size._4_4_);
    bdSpace::add_peer(&this->mNodeSpace,id,
                      filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>.
                      _M_impl._M_node._M_size._4_4_);
    bdPeer::bdPeer((bdPeer *)local_e8);
    memcpy(local_e8,id,0x24);
    peer.mPeerId.id.data[0xc] =
         filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node.
         _M_size._4_1_;
    peer.mPeerId.id.data[0xd] =
         filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node.
         _M_size._5_1_;
    peer.mPeerId.id.data[0xe] =
         filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node.
         _M_size._6_1_;
    peer.mPeerId.id.data[0xf] =
         filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl._M_node.
         _M_size._7_1_;
    peer.mLastSendTime = time((time_t *)0x0);
    bdStore::addStore(&this->mStore,(bdPeer *)local_e8);
    bdConnectManager::updatePotentialConnectionProxy
              (this->mConnMgr,id,
               filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
               _M_node._M_size._4_4_);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"bdNode::addPeer(");
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,id);
    poVar4 = std::operator<<((ostream *)&std::cerr,", ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    pvVar5 = (void *)std::ostream::operator<<
                               (pvVar5,filteredIPs.
                                       super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>.
                                       _M_impl._M_node._M_size._4_4_);
    std::ostream::operator<<(pvVar5,std::dec);
    std::operator<<((ostream *)&std::cerr,") FAILED the BAD PEER FILTER!!!! DISCARDING MSG");
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::list
              ((list<sockaddr_in,_std::allocator<sockaddr_in>_> *)local_38);
    bdFilter::filteredIPs
              (&this->mFilterPeers,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)local_38);
    bdStore::filterIpList(&this->mStore,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)local_38)
    ;
    bdPeerQueue::queuePeer
              (&this->mBadPeerQueue,id,
               filteredIPs.super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
               _M_node._M_size._4_4_);
    std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::~list
              ((list<sockaddr_in,_std::allocator<sockaddr_in>_> *)local_38);
  }
  return;
}

Assistant:

void bdNode::addPeer(const bdId *id, uint32_t peerflags) {

#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdNode::addPeer(");
	mFns->bdPrintId(std::cerr, id);
	fprintf(stderr, ")\n");
#endif

	/* first check the filters */
    if (mFilterPeers.checkPeer(id, peerflags)) {
		std::cerr << "bdNode::addPeer(";
		mFns->bdPrintId(std::cerr, id);
		std::cerr << ", " << std::hex << peerflags << std::dec;
		std::cerr << ") FAILED the BAD PEER FILTER!!!! DISCARDING MSG";
		std::cerr << std::endl;

		std::list<struct sockaddr_in> filteredIPs;
        mFilterPeers.filteredIPs(filteredIPs);
		mStore.filterIpList(filteredIPs);

        mBadPeerQueue.queuePeer(id, peerflags);

		return;
	}

	/* next we check if it is a friend, whitelist etc, and adjust flags */
	bdFriendEntry entry;

	if (mFriendList.findPeerEntry(&(id->id), entry)) {
		/* found! */
		peerflags |= entry.getPeerFlags(); // translates internal into general ones.

		struct sockaddr_in knownAddr;
		if (entry.addrKnown(&knownAddr))
			if (knownAddr.sin_addr.s_addr != id->addr.sin_addr.s_addr) {
#ifndef DISABLE_BAD_PEER_FILTER	
				std::cerr << "bdNode::addPeer(";
				mFns->bdPrintId(std::cerr, id);
				std::cerr << ", " << std::hex << peerflags << std::dec;
				std::cerr << ") MASQUERADING AS KNOWN PEER - FLAGGING AS BAD";
				std::cerr << std::endl;
				
				// Stores in queue for later callback and desemination around the network.
                mBadPeerQueue.queuePeer(id, peerflags);

                mFilterPeers.addPeerToFilter(id->addr, peerflags);

				std::list<struct sockaddr_in> filteredIPs;
                mFilterPeers.filteredIPs(filteredIPs);
				mStore.filterIpList(filteredIPs);

				// DO WE EXPLICITLY NEED TO DO THIS, OR WILL THEY JUST BE DROPPED?
				//mNodeSpace.remove_badpeer(id);
				//mQueryMgr->remove_badpeer(id);
	
				// FLAG in NodeSpace (Should be dropped very quickly anyway)
				mNodeSpace.flagpeer(id, 0, BITDHT_PEER_EXFLAG_BADPEER);
				return;
#endif
			}
	}

	mQueryMgr->addPeer(id, peerflags);
	mNodeSpace.add_peer(id, peerflags);

	bdPeer peer;
	peer.mPeerId = *id;
	peer.mPeerFlags = peerflags;
	peer.mLastRecvTime = time(NULL);
	mStore.addStore(&peer);

	// Finally we pass to connections for them to use.
	mConnMgr->updatePotentialConnectionProxy(id, peerflags);


//#define DISPLAY_BITDHTNODES	1
#ifdef DISPLAY_BITDHTNODES
	/* TEMP to extract IDS for BloomFilter */
	if (peerflags & BITDHT_PEER_STATUS_DHT_ENGINE) {
		std::cerr << "bdNode::addPeer() FOUND BITDHT PEER";
		std::cerr << std::endl;
		mFns->bdPrintNodeId(std::cerr, &(id->id));
		std::cerr << std::endl;
	}
#endif
}